

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void av1_copy_frame_mvs(AV1_COMMON *cm,MB_MODE_INFO *mi,int mi_row,int mi_col,int x_mis,int y_mis)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int8_t ref_idx;
  MV_REFERENCE_FRAME ref_frame;
  int idx;
  MV_REF *mv;
  int h;
  int w;
  MV_REF *frame_mvs;
  int frame_mvs_stride;
  int y_mis_local;
  int x_mis_local;
  int mi_col_local;
  int mi_row_local;
  MB_MODE_INFO *mi_local;
  AV1_COMMON *cm_local;
  
  iVar2 = (cm->mi_params).mi_cols + 1 >> 1;
  frame_mvs = cm->cur_frame->mvs + (long)((mi_row >> 1) * iVar2) + (long)(mi_col >> 1);
  for (h = 0; h < y_mis + 1 >> 1; h = h + 1) {
    mv = frame_mvs;
    for (w = 0; w < x_mis + 1 >> 1; w = w + 1) {
      mv->ref_frame = -1;
      (mv->mv).as_int = 0;
      for (idx = 0; idx < 2; idx = idx + 1) {
        cVar1 = mi->ref_frame[idx];
        if (('\0' < cVar1) && (cm->ref_frame_side[cVar1] == '\0')) {
          iVar3 = (int)mi->mv[idx].as_mv.row;
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          if (iVar3 < 0x1000) {
            iVar3 = (int)*(short *)((long)mi->mv + (long)idx * 4 + 2);
            if (iVar3 < 1) {
              iVar3 = -iVar3;
            }
            if (iVar3 < 0x1000) {
              mv->ref_frame = cVar1;
              mv->mv = mi->mv[idx];
            }
          }
        }
      }
      mv = mv + 1;
    }
    frame_mvs = frame_mvs + iVar2;
  }
  return;
}

Assistant:

void av1_copy_frame_mvs(const AV1_COMMON *const cm,
                        const MB_MODE_INFO *const mi, int mi_row, int mi_col,
                        int x_mis, int y_mis) {
  const int frame_mvs_stride = ROUND_POWER_OF_TWO(cm->mi_params.mi_cols, 1);
  MV_REF *frame_mvs =
      cm->cur_frame->mvs + (mi_row >> 1) * frame_mvs_stride + (mi_col >> 1);
  x_mis = ROUND_POWER_OF_TWO(x_mis, 1);
  y_mis = ROUND_POWER_OF_TWO(y_mis, 1);
  int w, h;

  for (h = 0; h < y_mis; h++) {
    MV_REF *mv = frame_mvs;
    for (w = 0; w < x_mis; w++) {
      mv->ref_frame = NONE_FRAME;
      mv->mv.as_int = 0;

      for (int idx = 0; idx < 2; ++idx) {
        MV_REFERENCE_FRAME ref_frame = mi->ref_frame[idx];
        if (ref_frame > INTRA_FRAME) {
          int8_t ref_idx = cm->ref_frame_side[ref_frame];
          if (ref_idx) continue;
          if ((abs(mi->mv[idx].as_mv.row) > REFMVS_LIMIT) ||
              (abs(mi->mv[idx].as_mv.col) > REFMVS_LIMIT))
            continue;
          mv->ref_frame = ref_frame;
          mv->mv.as_int = mi->mv[idx].as_int;
        }
      }
      mv++;
    }
    frame_mvs += frame_mvs_stride;
  }
}